

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-info.c
# Opt level: O1

_Bool obj_known_damage(object *obj,int *normal_damage,int *brand_damage,int *slay_damage,
                      _Bool *nonweap_slay,_Bool throw)

{
  wchar_t wVar1;
  _Bool *source;
  angband_constants *paVar2;
  player *ppVar3;
  _Bool _Var4;
  bool bVar5;
  _Bool _Var6;
  int16_t iVar7;
  wchar_t wVar8;
  wchar_t wVar9;
  int iVar10;
  object *poVar11;
  int iVar12;
  int iVar13;
  critical_level *pcVar14;
  wchar_t wVar15;
  ulong uVar16;
  int iVar17;
  int iVar18;
  int *piVar19;
  undefined7 in_register_00000089;
  critical_level *pcVar20;
  byte bVar21;
  player_state_conflict *state_00;
  object *poVar22;
  byte bVar23;
  uint uVar24;
  bool bVar25;
  bool bVar26;
  int local_1d4;
  wchar_t crit_round_mult;
  wchar_t crit_add;
  wchar_t crit_mult;
  wchar_t local_1c4;
  wchar_t crit_round_add;
  wchar_t crit_div;
  object *local_1b8;
  ulong local_1b0;
  object *local_1a8;
  wchar_t crit_scl_round;
  object *local_198;
  player *local_190;
  _Bool *total_slays;
  _Bool *total_brands;
  player *local_178;
  angband_constants *local_170;
  int *local_168;
  int *local_160;
  int *local_158;
  player_state state;
  
  local_190 = (player *)nonweap_slay;
  local_168 = normal_damage;
  local_160 = brand_damage;
  local_158 = slay_damage;
  poVar11 = equipped_item_by_slot_name(player,"shooting");
  _Var4 = tval_is_melee_weapon(obj);
  local_178 = (player *)CONCAT44(local_178._4_4_,(int)CONCAT71(in_register_00000089,throw));
  bVar5 = !throw;
  bVar21 = obj->tval;
  wVar9 = (player->state).ammo_tval;
  local_1b0 = CONCAT71(local_1b0._1_7_,poVar11 != (object *)0x0);
  local_1b8 = poVar11;
  wVar8 = slot_by_name(player,"weapon");
  local_1a8 = slot_object(player,wVar8);
  if (_Var4 && bVar5) {
    (player->body).slots[wVar8].obj = obj;
  }
  ppVar3 = player;
  memcpy(&state,&player->state,0x120);
  state.stat_ind[0] = L'\0';
  state.stat_ind[3] = L'\0';
  calc_bonuses(ppVar3,(player_state_conflict *)&state,true,false);
  (player->body).slots[wVar8].obj = local_1a8;
  poVar11 = obj->known;
  if (poVar11->ds == 0 || poVar11->dd == 0) {
    return false;
  }
  bVar23 = wVar9 == (uint)bVar21 & (byte)local_1b0;
  bVar21 = bVar5 & bVar23;
  local_1a8 = (object *)(ulong)((uint)poVar11->dd * (poVar11->ds + 1) * 5);
  local_198 = obj;
  wVar9 = object_to_hit(poVar11);
  poVar11 = local_198;
  if (_Var4 && bVar5) {
    wVar8 = object_to_dam(local_198->known);
    local_1b0 = (ulong)(uint)(wVar8 * 2);
    iVar7 = object_weight_one(poVar11);
    iVar18 = state.skills[6] * z_info->m_crit_chance_toh_skill_scl +
             (int)player->lev * z_info->m_crit_chance_level_scl +
             (wVar9 + state.to_h) * z_info->m_crit_chance_toh_scl +
             z_info->m_crit_chance_weight_scl * (int)iVar7 + z_info->m_crit_chance_offset;
    iVar10 = z_info->m_crit_chance_range;
    crit_round_add = L'\0';
    if (iVar18 < 1) {
      iVar18 = 0;
    }
    if (iVar10 < iVar18) {
      iVar18 = iVar10;
    }
    crit_div = L'd';
    if ((iVar18 < 1) || (z_info->m_crit_level_head == (critical_level *)0x0)) {
      crit_mult = L'd';
      crit_add = L'\0';
      crit_round_mult = L'\0';
      crit_scl_round = L'\x01';
    }
    else {
      iVar13 = z_info->m_crit_power_random;
      if (iVar13 < 1) {
        iVar17 = 0;
        iVar12 = 0;
      }
      else {
        iVar17 = (int)iVar7 * z_info->m_crit_power_weight_scl;
        wVar9 = iVar17 + iVar13;
        wVar8 = iVar17 + L'\x01';
        iVar12 = 0;
        iVar17 = 0;
        pcVar20 = z_info->m_crit_level_head;
        do {
          wVar1 = pcVar20->cutoff;
          wVar15 = wVar9 + L'\x01';
          if (((wVar9 < wVar1) || (pcVar14 = pcVar20->next, pcVar14 == (critical_level *)0x0)) ||
             (wVar15 = wVar1, wVar8 < wVar1)) {
            iVar17 = iVar17 + (pcVar20->mult + L'\xffffffff') * (wVar15 - wVar8);
            iVar12 = iVar12 + (wVar15 - wVar8) * pcVar20->add;
            pcVar14 = pcVar20->next;
            wVar8 = wVar15;
          }
          pcVar20 = pcVar14;
        } while (wVar8 <= wVar9);
      }
      crit_scl_round = iVar13 * (iVar10 / 100);
      crit_round_mult = (iVar17 * iVar18) % crit_scl_round;
      crit_mult = (iVar17 * iVar18) / crit_scl_round + L'd';
      crit_add = (iVar12 * iVar18) / crit_scl_round;
      crit_round_add = (iVar12 * iVar18) % crit_scl_round;
    }
    local_1d4 = state.to_d * 10;
    local_1b0 = CONCAT44(local_1b0._4_4_,(int)local_1b0 * 5);
    local_1c4 = state.num_blows;
    poVar11 = local_198;
    poVar22 = local_1b8;
  }
  else {
    state_00 = &player->state;
    iVar7 = object_weight_one(local_198);
    if (bVar21 == 0) {
      local_1c4 = L'\0';
      calculate_missile_crits
                ((player_state *)state_00,(int)iVar7,wVar9,false,&crit_mult,&crit_add,&crit_div,
                 &crit_round_mult,&crit_round_add,&crit_scl_round);
      wVar9 = object_to_dam(poVar11->known);
      iVar10 = (int)local_1a8;
      iVar7 = object_weight_one(poVar11);
      local_1a8 = (object *)(ulong)(uint)((int)(short)(iVar7 / 0xc + 2) * (iVar10 + wVar9 * 10));
      local_1b0 = local_1b0 & 0xffffffff00000000;
      local_1d4 = 0;
      poVar22 = local_1b8;
    }
    else {
      calculate_missile_crits
                ((player_state *)state_00,(int)iVar7,wVar9,true,&crit_mult,&crit_add,&crit_div,
                 &crit_round_mult,&crit_round_add,&crit_scl_round);
      wVar9 = object_to_dam(poVar11->known);
      poVar22 = local_1b8;
      wVar8 = object_to_dam(local_1b8->known);
      local_1a8 = (object *)(ulong)(uint)((int)local_1a8 + (wVar8 + wVar9) * 10);
      local_1c4 = L'\0';
      local_1b0 = local_1b0 & 0xffffffff00000000;
      local_1d4 = 0;
    }
  }
  local_198 = (object *)0x1;
  if (bVar21 != 0) {
    local_198 = (object *)(ulong)(uint)(player->state).ammo_mult;
  }
  bVar23 = bVar23 | (byte)local_178;
  total_brands = (_Bool *)mem_zalloc((ulong)z_info->brand_max);
  copy_brands(&total_brands,poVar11->known->brands);
  if (bVar21 == 0) {
    total_slays = (_Bool *)mem_zalloc((ulong)z_info->slay_max);
    poVar11 = poVar11->known;
LAB_00181473:
    copy_slays(&total_slays,poVar11->slays);
  }
  else {
    if (poVar22->known != (object *)0x0) {
      copy_brands(&total_brands,poVar22->known->brands);
    }
    total_slays = (_Bool *)mem_zalloc((ulong)z_info->slay_max);
    copy_slays(&total_slays,poVar11->known->slays);
    poVar11 = poVar22->known;
    if (poVar11 != (object *)0x0) goto LAB_00181473;
  }
  local_1b8 = (object *)(ulong)bVar23;
  uVar24 = (uint)bVar23;
  *(undefined1 *)&local_190->race = 0;
  if (_Var4 && bVar5) {
    if (2 < (player->body).count) {
      wVar9 = L'\x02';
      do {
        poVar11 = slot_object(player,wVar9);
        if (poVar11 != (object *)0x0) {
          source = poVar11->known->brands;
          if ((source != (_Bool *)0x0) || (poVar11->known->slays != (_Bool *)0x0)) {
            *(undefined1 *)&local_190->race = 1;
            copy_brands(&total_brands,source);
            copy_slays(&total_slays,poVar11->known->slays);
          }
        }
        wVar9 = wVar9 + L'\x01';
      } while ((uint)wVar9 < (uint)(player->body).count);
    }
    uVar24 = (uint)local_1b8;
    if (1 < z_info->brand_max) {
      wVar9 = L'\x01';
      do {
        _Var6 = player_has_temporary_brand(player,wVar9);
        if ((_Var6) && (_Var6 = append_brand(&total_brands,wVar9), _Var6)) {
          *(undefined1 *)&local_190->race = 1;
        }
        wVar9 = wVar9 + L'\x01';
      } while ((uint)wVar9 < (uint)z_info->brand_max);
    }
    if (1 < z_info->slay_max) {
      wVar9 = L'\x01';
      do {
        _Var6 = player_has_temporary_slay(player,wVar9);
        if ((_Var6) && (_Var6 = append_slay(&total_slays,wVar9), _Var6)) {
          *(undefined1 *)&local_190->race = 1;
        }
        wVar9 = wVar9 + L'\x01';
      } while ((uint)wVar9 < (uint)z_info->slay_max);
    }
  }
  ppVar3 = player;
  paVar2 = z_info;
  uVar24 = uVar24 - 1;
  local_170 = z_info;
  bVar23 = z_info->brand_max;
  if ((ulong)bVar23 < 2) {
    _Var6 = false;
  }
  else {
    iVar10 = (crit_div - (crit_div + L'\x01' >> 0x1f)) + 1 >> 1;
    local_190 = (player *)CONCAT44(local_190._4_4_,iVar10);
    local_178 = player;
    piVar19 = &brands[1].multiplier;
    uVar16 = 1;
    _Var6 = false;
    do {
      if (total_brands[uVar16] == true) {
        iVar18 = (*piVar19 + (int)local_198 + uVar24) * (int)local_1a8 + (int)local_1b0;
        iVar18 = (iVar18 * crit_round_mult + crit_round_add * 10) / crit_scl_round +
                 iVar18 * crit_mult + crit_add * 10;
        iVar13 = iVar18 % crit_div;
        iVar18 = iVar18 / crit_div + local_1d4;
        if (_Var4 && bVar5) {
          iVar13 = (iVar13 * local_1c4) / crit_div + iVar18 * local_1c4;
          iVar18 = iVar13 / 100;
          iVar13 = iVar13 % 100;
          bVar25 = SBORROW4(iVar13,0x32);
          iVar13 = iVar13 + -0x32;
LAB_001816e5:
          bVar25 = bVar25 == iVar13 < 0;
        }
        else {
          if (bVar21 != 0) {
            wVar9 = (ppVar3->state).num_shots;
            iVar13 = (iVar13 * wVar9) / crit_div + iVar18 * wVar9;
            iVar18 = iVar13 / 10;
            iVar13 = iVar13 % 10;
            bVar25 = SBORROW4(iVar13,5);
            iVar13 = iVar13 + -5;
            goto LAB_001816e5;
          }
          bVar25 = iVar10 < iVar13;
        }
        local_160[uVar16] = (uint)bVar25 + iVar18;
        _Var6 = true;
      }
      uVar16 = uVar16 + 1;
      piVar19 = piVar19 + 0xe;
    } while (bVar23 != uVar16);
  }
  ppVar3 = player;
  bVar23 = paVar2->slay_max;
  if (1 < (ulong)bVar23) {
    uVar24 = uVar24 + (int)local_198;
    iVar10 = (crit_div - (crit_div + L'\x01' >> 0x1f)) + 1 >> 1;
    local_190 = player;
    piVar19 = &slays[1].multiplier;
    uVar16 = 1;
    do {
      if (total_slays[uVar16] == true) {
        iVar18 = (*piVar19 + uVar24) * (int)local_1a8 + (int)local_1b0;
        iVar18 = (iVar18 * crit_round_mult + crit_round_add * 10) / crit_scl_round +
                 iVar18 * crit_mult + crit_add * 10;
        iVar13 = iVar18 % crit_div;
        iVar18 = iVar18 / crit_div + local_1d4;
        if (_Var4 && bVar5) {
          iVar13 = (iVar13 * local_1c4) / crit_div + iVar18 * local_1c4;
          iVar18 = iVar13 / 100;
          iVar13 = iVar13 % 100;
          bVar26 = SBORROW4(iVar13,0x32);
          bVar25 = iVar13 + -0x32 < 0;
        }
        else if (bVar21 == 0) {
          bVar26 = SBORROW4(iVar13,iVar10);
          bVar25 = iVar13 - iVar10 < 0;
        }
        else {
          wVar9 = (ppVar3->state).num_shots;
          iVar13 = (iVar13 * wVar9) / crit_div + iVar18 * wVar9;
          iVar18 = iVar13 / 10;
          iVar13 = iVar13 % 10;
          bVar26 = SBORROW4(iVar13,5);
          bVar25 = iVar13 + -5 < 0;
        }
        local_158[uVar16] = (uint)(bVar26 == bVar25) + iVar18;
        _Var6 = true;
      }
      uVar16 = uVar16 + 1;
      piVar19 = piVar19 + 0x10;
    } while (bVar23 != uVar16);
  }
  local_1b8 = (object *)(ulong)uVar24;
  iVar10 = (int)local_198 * (int)local_1a8 + (int)local_1b0;
  iVar10 = (iVar10 * crit_round_mult + crit_round_add * 10) / crit_scl_round +
           crit_mult * iVar10 + crit_add * 10;
  iVar18 = iVar10 % crit_div;
  local_1d4 = iVar10 / crit_div + local_1d4;
  if (_Var4 && bVar5) {
    iVar10 = (iVar18 * local_1c4) / crit_div + local_1d4 * local_1c4;
    local_1d4 = iVar10 / 100;
    iVar10 = iVar10 % 100;
    bVar5 = SBORROW4(iVar10,0x32);
    iVar10 = iVar10 + -0x32;
  }
  else {
    if (bVar21 == 0) {
      bVar5 = (crit_div - (crit_div + L'\x01' >> 0x1f)) + 1 >> 1 < iVar18;
      goto LAB_0018194a;
    }
    wVar9 = (player->state).num_shots;
    iVar10 = (iVar18 * wVar9) / crit_div + local_1d4 * wVar9;
    local_1d4 = iVar10 / 10;
    iVar10 = iVar10 % 10;
    bVar5 = SBORROW4(iVar10,5);
    iVar10 = iVar10 + -5;
  }
  bVar5 = bVar5 == iVar10 < 0;
LAB_0018194a:
  *local_168 = (uint)bVar5 + local_1d4;
  mem_free(total_brands);
  mem_free(total_slays);
  return _Var6;
}

Assistant:

bool obj_known_damage(const struct object *obj, int *normal_damage,
							 int *brand_damage, int *slay_damage,
							 bool *nonweap_slay, bool throw)
{
	int i;
	int dice, sides, dam, total_dam, plus = 0;
	int xtra_postcrit = 0, xtra_precrit = 0;
	int crit_mult, crit_div, crit_add;
	int crit_round_mult, crit_round_add, crit_scl_round;
	int temp0, temp1, round;
	int old_blows = 0;
	bool *total_brands;
	bool *total_slays;
	bool has_brands_or_slays = false;

	struct object *bow = equipped_item_by_slot_name(player, "shooting");
	bool weapon = tval_is_melee_weapon(obj) && !throw;
	bool ammo   = (player->state.ammo_tval == obj->tval) && (bow) && !throw;
	int melee_adj_mult = (ammo || throw) ? 0 : 1;
	int multiplier = 1;

	struct player_state state;
	int weapon_slot = slot_by_name(player, "weapon");
	struct object *current_weapon = slot_object(player, weapon_slot);

	/* Pretend we're wielding the object if it's a weapon */
	if (weapon)
		player->body.slots[weapon_slot].obj = (struct object *) obj;

	/* Calculate the player's hypothetical state */
	memcpy(&state, &player->state, sizeof(state));
	state.stat_ind[STAT_STR] = 0; //Hack - NRM
	state.stat_ind[STAT_DEX] = 0; //Hack - NRM
	calc_bonuses(player, &state, true, false);

	/* Stop pretending */
	player->body.slots[weapon_slot].obj = current_weapon;

	/* Finish if dice not known */
	dice = obj->known->dd;
	sides = obj->known->ds;
	if (!dice || !sides) return false;

	/* Calculate damage */
	dam = ((sides + 1) * dice * 5);

	plus += object_to_hit(obj->known);
	if (weapon)	{
		xtra_postcrit = state.to_d * 10;
		xtra_precrit += object_to_dam(obj->known) * 10;

		calculate_melee_crits(&state, object_weight_one(obj), plus,
			&crit_mult, &crit_add, &crit_div,
			&crit_round_mult, &crit_round_add, &crit_scl_round);

		old_blows = state.num_blows;
	} else if (ammo) {
		calculate_missile_crits(&player->state, object_weight_one(obj),
			plus, true, &crit_mult, &crit_add, &crit_div,
			&crit_round_mult, &crit_round_add, &crit_scl_round);

		dam += (object_to_dam(obj->known) * 10);
		dam += (object_to_dam(bow->known) * 10);
	} else {
		calculate_missile_crits(&player->state, object_weight_one(obj),
			plus, false, &crit_mult, &crit_add, &crit_div,
			&crit_round_mult, &crit_round_add, &crit_scl_round);

		dam += (object_to_dam(obj->known) * 10);
		dam *= 2 + object_weight_one(obj) / 12;
	}

	if (ammo) multiplier = player->state.ammo_mult;

	/* Get the brands */
	total_brands = mem_zalloc(z_info->brand_max * sizeof(bool));
	copy_brands(&total_brands, obj->known->brands);
	if (ammo && bow->known)
		copy_brands(&total_brands, bow->known->brands);

	/* Get the slays */
	total_slays = mem_zalloc(z_info->slay_max * sizeof(bool));
	copy_slays(&total_slays, obj->known->slays);
	if (ammo && bow->known)
		copy_slays(&total_slays, bow->known->slays);

	/*
	 * Melee weapons may get slays and brands from other items or from
	 * temporary effects.
	 */
	*nonweap_slay = false;
	if (weapon)	{
		for (i = 2; i < player->body.count; i++) {
			struct object *slot_obj = slot_object(player, i);
			if (!slot_obj)
				continue;

			if (slot_obj->known->brands || slot_obj->known->slays)
				*nonweap_slay = true;
			else
				continue;

			/* Replace the old lists with new ones */
			copy_brands(&total_brands, slot_obj->known->brands);
			copy_slays(&total_slays, slot_obj->known->slays);
		}

		for (i = 1; i < z_info->brand_max; i++) {
			if (player_has_temporary_brand(player, i)
					&& append_brand(&total_brands, i)) {
				*nonweap_slay = true;
			}
		}

		for (i = 1; i < z_info->slay_max; i++) {
			if (player_has_temporary_slay(player, i)
					&& append_slay(&total_slays, i)) {
				*nonweap_slay = true;
			}
		}
	}

	/* Get damage for each brand that is active */
	for (i = 1; i < z_info->brand_max; i++) {
		if (!total_brands[i]) {
			continue;
		}
		has_brands_or_slays = true;

		/* Include bonus damage and brand in stated average */
		temp0 = dam * (multiplier + brands[i].multiplier
			- melee_adj_mult) + xtra_precrit;
		temp1 = temp0 * crit_mult + 10 * crit_add
			+ (temp0 * crit_round_mult + 10 * crit_round_add)
			/ crit_scl_round;
		total_dam = temp1 / crit_div + xtra_postcrit;
		round = temp1 % crit_div;

		if (weapon) {
			temp0 = total_dam * old_blows
				+ (round * old_blows) / crit_div;
			total_dam = temp0 / 100 + ((temp0 % 100 >= 50) ? 1 : 0);
		} else if (ammo) {
			temp0 = total_dam * player->state.num_shots
				+ (round * player->state.num_shots) / crit_div;
			total_dam = temp0 / 10 + ((temp0 % 10 >= 5) ? 1 : 0);
		} else {
			total_dam += (round > (crit_div + 1) / 2) ? 1 : 0;
		}

		brand_damage[i] = total_dam;
	}

	/* Get damage for each slay that is active */
	for (i = 1; i < z_info->slay_max; i++) {
		if (!total_slays[i]) {
			continue;
		}
		has_brands_or_slays = true;

		/* Include bonus damage and slay in stated average */
		temp0 = dam * (multiplier + slays[i].multiplier
			- melee_adj_mult) + xtra_precrit;
		temp1 = temp0 * crit_mult + 10 * crit_add
			+ (temp0 * crit_round_mult + 10 * crit_round_add)
			/ crit_scl_round;
		total_dam = temp1 / crit_div + xtra_postcrit;
		round = temp1 % crit_div;

		if (weapon) {
			temp0 = total_dam * old_blows
				+ (round * old_blows) / crit_div;
			total_dam = temp0 / 100 + ((temp0 % 100 >= 50) ? 1 : 0);
		} else if (ammo) {
			temp0 = total_dam * player->state.num_shots
				+ (round * player->state.num_shots) / crit_div;
			total_dam = temp0 / 10 + ((temp0 % 10 >= 5) ? 1 : 0);
		} else {
			total_dam += (round >= (crit_div + 1) / 2) ? 1 : 0;
		}

		slay_damage[i] = total_dam;
	}

	/* Include bonus damage in stated average */
	temp0 = dam * multiplier + xtra_precrit;
	temp1 = temp0 * crit_mult + 10 * crit_add
		+ (temp0 * crit_round_mult + 10 * crit_round_add)
		/ crit_scl_round;
	total_dam = temp1 / crit_div + xtra_postcrit;
	round = temp1 % crit_div;

	/* Normal damage, not considering brands or slays */
	if (weapon) {
		temp0 = total_dam * old_blows
			+ (round * old_blows) / crit_div;
		total_dam = temp0 / 100 + ((temp0 % 100 >= 50) ? 1 : 0);
	} else if (ammo) {
		temp0 = total_dam * player->state.num_shots
			+ (round * player->state.num_shots) / crit_div;
		total_dam = temp0 / 10 + ((temp0 % 10 >= 5) ? 1 : 0);
	} else {
		total_dam += (round > (crit_div + 1) / 2) ? 1 : 0;
	}

	*normal_damage = total_dam;

	mem_free(total_brands);
	mem_free(total_slays);
	return has_brands_or_slays;
}